

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O3

RotationYY<std::complex<double>_> *
qclab::qgates::operator/
          (RotationYY<std::complex<double>_> *__return_storage_ptr__,
          RotationYY<std::complex<double>_> *lhs,RotationYY<std::complex<double>_> *rhs)

{
  double dVar1;
  angle_type aVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  
  iVar9 = (lhs->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems[0];
  iVar8 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar9 != iVar8) {
    __assert_fail("lhs.qubit() == rhs.qubit()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationYY.hpp"
                  ,0xd2,
                  "RotationYY<T> qclab::qgates::operator/(RotationYY<T>, const RotationYY<T> &)");
  }
  iVar9 = (*(lhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(lhs);
  iVar8 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar9 == iVar8) {
    dVar4 = (rhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_;
    dVar5 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_;
    dVar6 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_;
    dVar1 = (rhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_;
    dVar3 = dVar4 * dVar6 + -dVar5 * dVar1;
    aVar2.sin_._0_4_ = SUB84(dVar3,0);
    aVar2.cos_ = dVar4 * dVar5 + dVar6 * dVar1;
    aVar2.sin_._4_4_ = (int)((ulong)dVar3 >> 0x20);
    (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_ = aVar2;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).super_QAdjustable.fixed_ =
         (lhs->super_QRotationGate2<std::complex<double>_>).super_QAdjustable.fixed_;
    uVar7 = *(undefined8 *)&(lhs->super_QRotationGate2<std::complex<double>_>).field_0x14;
    dVar1 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_;
    dVar3 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_;
    *(undefined8 *)
     (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems =
         *(undefined8 *)(lhs->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems;
    *(undefined8 *)&(__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).field_0x14
         = uVar7;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_ =
         dVar1;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar3;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).
    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004ecad0;
    return __return_storage_ptr__;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationYY.hpp"
                ,0xc2,
                "RotationYY<T> &qclab::qgates::RotationYY<std::complex<double>>::operator/=(const RotationYY<T> &) [T = std::complex<double>]"
               );
}

Assistant:

RotationYY< T > operator/( RotationYY< T > lhs ,
                                         const RotationYY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }